

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Foo_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  byte *buf_00;
  ulong uVar2;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte *pbVar3;
  uint64_t uVar11;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar2 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar2 = (long)buf[6] << 8;
    case 6:
      uVar2 = uVar2 | (long)buf[5] << 0x10;
    case 5:
      uVar2 = uVar2 | (long)buf[4] << 0x18;
    case 4:
      uVar2 = uVar2 | (long)buf[3] << 0x20;
    case 3:
      uVar2 = uVar2 | (long)buf[2] << 0x28;
    case 2:
      uVar2 = uVar2 | (long)buf[1] << 0x30;
    case 1:
      uVar2 = uVar2 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar2 = *(ulong *)buf;
    uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  if (uVar2 == 0x496e506172656e74) {
    puVar1 = (ulong *)(buf + 8);
    if ((ulong)((long)end - (long)puVar1) < 8) {
      uVar2 = 0;
      switch((long)end - (long)puVar1) {
      case 7:
        uVar2 = (long)buf[0xe] << 8;
      case 6:
        uVar2 = uVar2 | (long)buf[0xd] << 0x10;
      case 5:
        uVar2 = uVar2 | (long)buf[0xc] << 0x18;
      case 4:
        uVar2 = uVar2 | (long)buf[0xb] << 0x20;
      case 3:
        uVar2 = uVar2 | (long)buf[10] << 0x28;
      case 2:
        uVar2 = uVar2 | (long)buf[9] << 0x30;
      case 1:
        uVar2 = uVar2 | (ulong)(byte)*puVar1 << 0x38;
      }
    }
    else {
      uVar2 = *puVar1;
      uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    if (uVar2 != 0x4e616d6573706163) {
      return buf;
    }
    buf_00 = (byte *)(buf + 0x10);
    if ((ulong)((long)end - (long)buf_00) < 8) {
      bVar4 = 0;
      bVar5 = 0;
      bVar6 = 0;
      bVar7 = 0;
      bVar8 = 0;
      bVar9 = 0;
      bVar10 = 0;
      switch((long)end - (long)buf_00) {
      case 7:
        bVar4 = buf[0x16] >> 7;
      case 6:
        bVar5 = bVar4 | buf[0x15] >> 7;
      case 5:
        bVar6 = bVar5 | buf[0x14] >> 7;
      case 4:
        bVar7 = bVar6 | buf[0x13] >> 7;
      case 3:
        bVar8 = bVar7 | buf[0x12] >> 7;
      case 2:
        bVar9 = bVar8 | buf[0x11] >> 7;
      case 1:
        bVar10 = bVar9 | *buf_00;
      }
    }
    else {
      bVar10 = (byte)*(undefined8 *)buf_00;
    }
    if (bVar10 != 0x65) {
      return buf;
    }
    pbVar3 = (byte *)flatcc_json_parser_match_constant(ctx,(char *)buf_00,end,1,aggregate);
    if (pbVar3 == buf_00) {
      return buf;
    }
    uVar11 = 1;
  }
  else {
    if ((int)(uVar2 >> 0x20) != 0x4e4f4e45) {
      return buf;
    }
    pbVar3 = (byte *)flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pbVar3 == (byte *)buf) {
      return buf;
    }
    uVar11 = 0;
  }
  *value = uVar11;
  *value_sign = 0;
  return (char *)pbVar3;
}

Assistant:

static const char *MyGame_Example_Foo_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w == 0x496e506172656e74) { /* descend "InParent" */
        buf += 8;
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x4e616d6573706163) { /* descend "Namespac" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xff00000000000000) == 0x6500000000000000) { /* "e" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "e" */
                return unmatched;
            } /* "e" */
        } else { /* descend "Namespac" */
            return unmatched;
        } /* descend "Namespac" */
    } else { /* descend "InParent" */
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "NONE" */
            return unmatched;
        } /* "NONE" */
    } /* descend "InParent" */
    return buf;
}